

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

ssize_t __thiscall
gvr::anon_unknown_3::PLYValueLittleUInt16::read
          (PLYValueLittleUInt16 *this,int __fd,void *__buf,size_t __nbytes)

{
  ushort uVar1;
  short sVar2;
  
  uVar1 = std::streambuf::sbumpc();
  this->value = uVar1 & 0xff;
  sVar2 = std::streambuf::sbumpc();
  this->value = this->value | sVar2 << 8;
  return (ssize_t)this;
}

Assistant:

void read(std::streambuf *in)
    {
      value=static_cast<unsigned short>(in->sbumpc()&0xff);
      value|=static_cast<unsigned short>((in->sbumpc()&0xff)<<8);
    }